

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rope.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  long lVar14;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  undefined4 in_register_0000003c;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  double dVar24;
  uint local_e4;
  undefined4 local_d8;
  int64_t ne [4];
  char *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> work_buffer;
  int sections [4];
  
  work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = ggml_init(CONCAT44(in_register_0000003c,param_1));
  local_a0 = "diff / sum0 < 0.0001f";
  local_e4 = 0;
  while( true ) {
    ne[2] = 0x49;
    ne[3] = 1;
    ne[0]._0_4_ = 0x100;
    ne[0]._4_4_ = 0;
    ne[1]._0_4_ = 0x20;
    ne[1]._4_4_ = 0;
    lVar10 = ggml_new_tensor(uVar9,0,4,ne);
    if (0 < ne[3]) {
      lVar21 = 0;
      lVar11 = ne[2];
      lVar12 = ne[3];
      do {
        if (0 < lVar11) {
          lVar17 = CONCAT44(ne[1]._4_4_,(undefined4)ne[1]);
          lVar23 = 0;
          do {
            if (0 < lVar17) {
              lVar12 = CONCAT44(ne[0]._4_4_,(undefined4)ne[0]);
              lVar19 = 0;
              do {
                if (0 < lVar12) {
                  lVar20 = 0;
                  do {
                    iVar7 = rand();
                    lVar12 = CONCAT44(ne[0]._4_4_,(undefined4)ne[0]);
                    lVar17 = CONCAT44(ne[1]._4_4_,(undefined4)ne[1]);
                    *(float *)(((lVar21 * ne[2] + lVar23) * lVar17 + lVar19) * lVar12 * 4 +
                               *(long *)(lVar10 + 0xf8) + lVar20 * 4) =
                         (float)iVar7 * 4.656613e-10 + (float)iVar7 * 4.656613e-10 + -1.0;
                    lVar20 = lVar20 + 1;
                    lVar11 = ne[2];
                  } while (lVar20 < lVar12);
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 < lVar17);
            }
            lVar23 = lVar23 + 1;
            lVar12 = ne[3];
          } while (lVar23 < lVar11);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < lVar12);
    }
    if (local_e4 < 3) {
      lVar11 = ggml_new_tensor_1d(uVar9,0x1a,ne[2]);
      lVar12 = ggml_new_tensor_1d(uVar9,0x1a,ne[2]);
      lVar21 = ggml_new_tensor_1d(uVar9,0x1a,ne[2]);
      if (0 < ne[2]) {
        lVar17 = *(long *)(lVar11 + 0xf8);
        lVar23 = *(long *)(lVar12 + 0xf8);
        lVar19 = *(long *)(lVar21 + 0xf8);
        lVar20 = 0;
        do {
          *(int *)(lVar17 + lVar20 * 4) = (int)lVar20 + 100;
          *(undefined4 *)(lVar23 + lVar20 * 4) = 0xffffffbd;
          *(int *)(lVar19 + lVar20 * 4) = (int)lVar20 + 0x21;
          lVar20 = lVar20 + 1;
        } while (ne[2] != lVar20);
      }
      cVar6 = (local_e4 != 1) * '\x02' + '\x02';
      if (local_e4 == 0) {
        cVar6 = '\0';
      }
      uVar13 = ggml_rope(uVar9,lVar10,lVar11,0x80,cVar6);
      lVar11 = ggml_rope(uVar9,uVar13,lVar12,0x80,cVar6);
      lVar10 = ggml_rope(uVar9,lVar10,lVar21,0x80,cVar6);
    }
    else {
      lVar11 = ggml_new_tensor_1d(uVar9,0x1a,ne[2] << 2);
      lVar12 = ggml_new_tensor_1d(uVar9,0x1a,ne[2] << 2);
      lVar21 = ggml_new_tensor_1d(uVar9,0x1a,ne[2] << 2);
      sections[0] = 0x10;
      sections[1] = 0x18;
      sections[2] = 0x18;
      sections[3] = 0;
      if (0 < ne[2]) {
        lVar17 = *(long *)(lVar11 + 0xf8);
        lVar23 = *(long *)(lVar12 + 0xf8);
        lVar19 = *(long *)(lVar21 + 0xf8);
        iVar7 = 100;
        lVar20 = 0;
        do {
          lVar18 = 4;
          lVar14 = 0;
          iVar22 = iVar7;
          do {
            *(int *)(lVar17 + lVar14) = iVar22;
            *(undefined4 *)(lVar23 + lVar14) = 0xffffffbd;
            *(int *)(lVar19 + lVar14) = iVar22 + -0x43;
            iVar22 = iVar22 + 1;
            lVar14 = lVar14 + ne[2] * 4;
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
          lVar20 = lVar20 + 1;
          iVar7 = iVar7 + 1;
          lVar19 = lVar19 + 4;
          lVar23 = lVar23 + 4;
          lVar17 = lVar17 + 4;
        } while (lVar20 != ne[2]);
      }
      uVar8 = (uint)(local_e4 != 3) << 4 | 8;
      uVar13 = ggml_rope_multi(0x49742400,0x3f800000,0,0x3f800000,0x42000000,0x3f800000,uVar9,lVar10
                               ,lVar11,0,0x80,sections,uVar8,0x8000);
      lVar11 = ggml_rope_multi(0x49742400,0x3f800000,0,0x3f800000,0x42000000,0x3f800000,uVar9,uVar13
                               ,lVar12,0,0x80,sections,uVar8,0x8000);
      lVar10 = ggml_rope_multi(0x49742400,0x3f800000,0,0x3f800000,uVar9,lVar10,lVar21,0,0x80,
                               sections,uVar8,0x8000);
    }
    uVar15 = ggml_new_graph(uVar9);
    ggml_build_forward_expand(uVar15,uVar13);
    ggml_build_forward_expand(uVar15,lVar11);
    ggml_build_forward_expand(uVar15,lVar10);
    ggml_graph_plan(sections,uVar15,4);
    if (sections._0_8_ != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&work_buffer,sections._0_8_);
      sections._8_8_ =
           work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ggml_graph_compute(uVar15,sections);
    lVar12 = *(long *)(lVar11 + 0xf8);
    lVar10 = *(long *)(lVar10 + 0xf8);
    uVar8 = ggml_nelements(lVar11);
    if ((int)uVar8 < 1) {
      dVar4 = 0.0;
      dVar5 = 0.0;
      dVar24 = 0.0;
    }
    else {
      dVar4 = 0.0;
      dVar5 = 0.0;
      dVar24 = 0.0;
      uVar16 = 0;
      do {
        fVar1 = *(float *)(lVar12 + uVar16 * 4);
        fVar2 = *(float *)(lVar10 + uVar16 * 4);
        dVar4 = dVar4 + (double)ABS(fVar1);
        dVar5 = dVar5 + (double)ABS(fVar2);
        dVar24 = dVar24 + (double)ABS(fVar1 - fVar2);
        uVar16 = uVar16 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar16);
    }
    auVar3._8_4_ = SUB84(dVar5,0);
    auVar3._0_8_ = dVar4;
    auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
    printf("mode: %d\n");
    local_d8 = SUB84(dVar4,0);
    printf("sum0: %f\n",local_d8);
    printf("sum1: %f\n");
    printf("diff: %f\n",SUB84(dVar24,0));
    printf("rel err: %f\n");
    printf("rel err: %f\n");
    if (9.999999747378752e-05 <= dVar24 / dVar4) break;
    if (9.999999747378752e-05 <= dVar24 / auVar3._8_8_) {
      uVar9 = 0xff;
      local_a0 = "diff / sum1 < 0.0001f";
      goto LAB_001018e1;
    }
    local_e4 = local_e4 + 1;
    if (local_e4 == 5) {
      ggml_free(uVar9);
      if (work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(work_buffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)work_buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)work_buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
  }
  uVar9 = 0xfe;
LAB_001018e1:
  uVar9 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-rope.cpp"
                     ,uVar9,"GGML_ASSERT(%s) failed",local_a0);
  if (work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)work_buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)work_buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

int main(int /*argc*/, const char ** /*argv*/) {
    struct ggml_init_params params = {
        /* .mem_size   = */ 128*1024*1024,
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ false,
    };

    std::vector<uint8_t> work_buffer;

    struct ggml_context * ctx0 = ggml_init(params);

    struct ggml_tensor * x;

    // rope f32
    for (int m = 0; m < 5; ++m) {
        const int ndims = 4;

        const int64_t n_rot = 128;
        const int64_t ne[4] = { 2*n_rot, 32, 73, 1 };

        const int n_past_0 = 100;
        const int n_past_2 = 33;

        struct ggml_tensor * r0;
        struct ggml_tensor * r1;
        struct ggml_tensor * r2;
        x = get_random_tensor_f32(ctx0, ndims, ne, -1.0f, 1.0f);
        int mode = -1;

        if (m < 3) {
            struct ggml_tensor * p0 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);
            struct ggml_tensor * p1 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);
            struct ggml_tensor * p2 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);

            for (int i = 0; i < ne[2]; ++i) {
                ((int32_t *) p0->data)[i] = n_past_0 + i;
                ((int32_t *) p1->data)[i] = n_past_2 - n_past_0;
                ((int32_t *) p2->data)[i] = n_past_2 + i;
            }
            // test mode 0, 2, 4 (standard, GPT-NeoX, GLM)
            mode = m == 0 ? 0 : m == 1 ? 2 : 4;

            // 100, 101, 102, ..., 172
            r0 = ggml_rope(ctx0, x,  p0, n_rot, mode);
            // -67, -67, -67, ..., -67
            r1 = ggml_rope(ctx0, r0, p1, n_rot, mode); // "context swap", i.e. forget n_past_0 - n_past_2 tokens

            //  33,  34,  35, ..., 105
            r2 = ggml_rope(ctx0, x,  p2, n_rot, mode);
        } else {
            // testing multi-dimension rope position embedding mode
            struct ggml_tensor * p0 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);
            struct ggml_tensor * p1 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);
            struct ggml_tensor * p2 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);

            int sections[4] = {16, 24, 24, 0};
            mode = (m == 3) ? GGML_ROPE_TYPE_MROPE : GGML_ROPE_TYPE_VISION;

            for (int i = 0; i < ne[2]; ++i) {
                for (int j = 0; j < 4; ++j) {
                    ((int32_t *) p0->data)[i + ne[2] * j] = n_past_0 + i + j;
                    ((int32_t *) p1->data)[i + ne[2] * j] = n_past_2 - n_past_0;
                    ((int32_t *) p2->data)[i + ne[2] * j] = n_past_2 + i + j;
                }
            }

            // [[100, 101, 102, ..., 172],
            // [101, 102, 103, ..., 173],
            // [102, 103, 104, ..., 174]]
            r0 = ggml_rope_multi(
                ctx0, x, p0, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);
            // [[-67, -67, -67, ..., -67]
            // [-67, -67, -67, ..., -67]
            // [-67, -67, -67, ..., -67]]
            r1 = ggml_rope_multi(
                ctx0, r0, p1, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);

            //  [[33,  34,  35, ..., 105]
            //  [34,  35,  36, ..., 106]
            //  [35,  36,  37, ..., 107]]
            r2 = ggml_rope_multi(
                ctx0, x, p2, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);
        }

        ggml_cgraph * gf = ggml_new_graph(ctx0);

        ggml_build_forward_expand(gf, r0);
        ggml_build_forward_expand(gf, r1);
        ggml_build_forward_expand(gf, r2);

        ggml_graph_compute_helper(work_buffer, gf, 4);

        // check that r1 and r2 are the same
        {
            double sum0 = 0.0f;
            double sum1 = 0.0f;
            double diff = 0.0f;

            const float * r1_data = (float *) r1->data;
            const float * r2_data = (float *) r2->data;

            const int n_elements = ggml_nelements(r1);

            for (int i = 0; i < n_elements; ++i) {
                sum0 += fabs(r1_data[i]);
                sum1 += fabs(r2_data[i]);
                diff += fabs(r1_data[i] - r2_data[i]);
                //if (fabs(r1_data[i] - r2_data[i]) > 0.0001f) {
                //    printf("%d: %f %f\n", i, r1_data[i], r2_data[i]);
                //    printf("diff: %f\n", fabs(r1_data[i] - r2_data[i]));
                //}
            }

            //for (int i = 4096; i < 4096 + 128; ++i) {
            //    printf("%f %f\n", r1_data[i], r2_data[i]);
            //}

            printf("mode: %d\n", mode);
            printf("sum0: %f\n", sum0);
            printf("sum1: %f\n", sum1);
            printf("diff: %f\n", diff);
            printf("rel err: %f\n", diff / sum0);
            printf("rel err: %f\n", diff / sum1);

            GGML_ASSERT(diff / sum0 < 0.0001f);
            GGML_ASSERT(diff / sum1 < 0.0001f);
        }
    }

    ggml_free(ctx0);

    return 0;
}